

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O2

uint CountDecimalDigit32(uint32_t n)

{
  uint uVar1;
  
  if (n < 10) {
    uVar1 = 1;
  }
  else if (n < 100) {
    uVar1 = 2;
  }
  else if (n < 1000) {
    uVar1 = 3;
  }
  else if (n < 10000) {
    uVar1 = 4;
  }
  else if (n < 100000) {
    uVar1 = 5;
  }
  else if (n < 1000000) {
    uVar1 = 6;
  }
  else if (n < 10000000) {
    uVar1 = 7;
  }
  else {
    if (99999999 < n) {
      return 10 - (n < 1000000000);
    }
    uVar1 = 8;
  }
  return uVar1;
}

Assistant:

inline unsigned CountDecimalDigit32(uint32_t n) {
	// Simple pure C++ implementation was faster than __builtin_clz version in this situation.
	if (n < 10) return 1;
	if (n < 100) return 2;
	if (n < 1000) return 3;
	if (n < 10000) return 4;
	if (n < 100000) return 5;
	if (n < 1000000) return 6;
	if (n < 10000000) return 7;
	if (n < 100000000) return 8;
	if (n < 1000000000) return 9;
	return 10;
}